

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O2

size_t __thiscall
std::
hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>_>
::operator()(hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>_>
             *this,reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>_>
                   x)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = mp::HashStreamerCombine::HashArray<std::array<int,1ul>>
                    (0,&((x._M_data)->
                        super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::LogId>
                        ).args_);
  uVar2 = sVar1 + 0x9e3779b9;
  sVar1 = mp::HashStreamerCombine::HashArray<std::array<int,0ul>>
                    (0,(array<int,_0UL> *)
                       &((x._M_data)->
                        super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::LogId>
                        ).field_0x4);
  return sVar1 + uVar2 * 0x40 + (uVar2 >> 2) + 0x9e3779b9 ^ uVar2;
}

Assistant:

size_t operator()( std::reference_wrapper<
        const mp::CustomFunctionalConstraint
          <Args, Params, NumOrLogic, Id> > x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Args>{}(x.get().GetArguments()));
    hs.Add(std::hash<Params>{}(x.get().GetParameters()));
    return hs.FinalizeHashValue();
  }